

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

void Ga2_ManAddToAbsOneStatic(Ga2_Man_t *p,Gia_Obj_t *pObj,int f,int fUseId)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  void **ppvVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  Gia_Man_t *pGVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  Gia_Obj_t *pGVar16;
  long lVar17;
  bool bVar18;
  int iLitOut;
  uint local_64;
  ulong local_60;
  undefined8 local_58;
  uint local_4c;
  uint local_48 [6];
  
  uVar6 = Ga2_ObjFindLit(p,pObj,f);
  if (uVar6 == 0xffffffff) {
    iVar7 = p->nSatVars;
    p->nSatVars = iVar7 + 1;
    uVar6 = iVar7 * 2;
    Ga2_ObjAddLit(p,pObj,f,uVar6);
  }
  local_64 = uVar6;
  if ((int)uVar6 < 2) {
    __assert_fail("iLitOut > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                  ,0x31d,"void Ga2_ManAddToAbsOneStatic(Ga2_Man_t *, Gia_Obj_t *, int, int)");
  }
  uVar1 = *(ulong *)pObj;
  if ((~uVar1 & 0x1fffffff1fffffff) == 0) {
    pGVar12 = p->pGia;
  }
  else {
    uVar14 = (uint)uVar1;
    uVar11 = (uint)(uVar1 >> 0x20);
    if (((uVar14 & 0x9fffffff) != 0x9fffffff) ||
       (pGVar12 = p->pGia, (int)(uVar11 & 0x1fffffff) < pGVar12->vCis->nSize - pGVar12->nRegs)) {
      if (((int)uVar14 < 0) || ((uVar14 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x31e,"void Ga2_ManAddToAbsOneStatic(Ga2_Man_t *, Gia_Obj_t *, int, int)");
      }
      pGVar12 = p->pGia;
    }
    if ((f != 0 || (uVar14 & 0x9fffffff) != 0x9fffffff) ||
       ((int)(uVar11 & 0x1fffffff) < pGVar12->vCis->nSize - pGVar12->nRegs)) {
      p->vLits->nSize = 0;
      Ga2_ObjLeaves(pGVar12,pObj);
      if (Ga2_ObjLeaves::v.nSize < 1) {
        pGVar12 = p->pGia;
        pGVar16 = pObj;
      }
      else {
        bVar5 = true;
        lVar17 = 0;
        local_60 = (ulong)uVar6;
        local_58 = pObj;
        do {
          iVar7 = Ga2_ObjLeaves::v.pArray[lVar17];
          if (((long)iVar7 < 0) || (pGVar12 = p->pGia, pGVar12->nObjs <= iVar7)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar12->pObjs == (Gia_Obj_t *)0x0) break;
          iVar15 = 0;
          if (((uint)*(undefined8 *)local_58 & 0x9fffffff) == 0x9fffffff) {
            iVar15 = -(uint)(pGVar12->vCis->nSize - pGVar12->nRegs <=
                            (int)((uint)((ulong)*(undefined8 *)local_58 >> 0x20) & 0x1fffffff));
          }
          pGVar16 = pGVar12->pObjs + iVar7;
          iVar7 = Ga2_ObjFindLit(p,pGVar16,iVar15 + f);
          if (iVar7 == -1) {
            iVar7 = p->nSatVars;
            p->nSatVars = iVar7 + 1;
            iVar7 = iVar7 * 2;
            Ga2_ObjAddLit(p,pGVar16,iVar15 + f,iVar7);
          }
          Vec_IntPush(p->vLits,iVar7);
          if (iVar7 < 2) {
            bVar5 = false;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < Ga2_ObjLeaves::v.nSize);
        pGVar16 = local_58;
        pGVar12 = p->pGia;
        uVar6 = (uint)local_60;
        if ((!bVar5) &&
           ((((uint)*(undefined8 *)local_58 & 0x9fffffff) != 0x9fffffff ||
            ((int)((uint)((ulong)*(undefined8 *)local_58 >> 0x20) & 0x1fffffff) <
             pGVar12->vCis->nSize - pGVar12->nRegs)))) {
          uVar6 = Ga2_ObjComputeTruthSpecial(pGVar12,local_58,&Ga2_ObjLeaves::v,p->vLits);
          pGVar2 = p->pGia->pObjs;
          if ((pGVar2 <= pGVar16) && (pGVar16 < pGVar2 + p->pGia->nObjs)) {
            piVar4 = p->vLits->pArray;
            pcVar8 = p->pSopSizes;
            local_58 = (Gia_Obj_t *)(CONCAT44(local_58._4_4_,uVar6) & 0xffffffff0000ffff);
            local_4c = uVar6 & 0xffff ^ 0xffff;
            uVar6 = 0;
            bVar5 = true;
            do {
              uVar14 = local_4c;
              if (bVar5) {
                uVar14 = (uint)local_58;
              }
              if ('\0' < pcVar8[uVar14]) {
                uVar6 = uVar6 ^ (uint)local_60;
                lVar17 = 0;
                do {
                  iVar15 = 1;
                  lVar10 = 3;
                  iVar7 = (int)p->pSops[uVar14][lVar17];
                  do {
                    local_48[0] = uVar6;
                    if (iVar7 % 3 == 1) {
                      uVar11 = piVar4[lVar10];
                      if ((int)uVar11 < 2) {
                        __assert_fail("Lits[b] > 1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                                      ,0x2a3,
                                      "void Ga2_ManCnfAddDynamic(Ga2_Man_t *, int, int *, int, int)"
                                     );
                      }
                      uVar11 = uVar11 ^ 1;
LAB_0060045c:
                      lVar13 = (long)iVar15;
                      iVar15 = iVar15 + 1;
                      local_48[lVar13] = uVar11;
                    }
                    else if (iVar7 % 3 == 0) {
                      uVar11 = piVar4[lVar10];
                      if ((int)uVar11 < 2) {
                        __assert_fail("Lits[b] > 1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                                      ,0x29e,
                                      "void Ga2_ManCnfAddDynamic(Ga2_Man_t *, int, int *, int, int)"
                                     );
                      }
                      goto LAB_0060045c;
                    }
                    bVar18 = lVar10 != 0;
                    lVar10 = lVar10 + -1;
                    iVar7 = iVar7 / 3;
                  } while (bVar18);
                  sat_solver2_addclause
                            (p->pSat,(lit *)local_48,(lit *)(local_48 + iVar15),
                             (int)((ulong)((long)pGVar16 - (long)pGVar2) >> 2) * -0x55555555);
                  lVar17 = lVar17 + 1;
                  pcVar8 = p->pSopSizes;
                } while (lVar17 < pcVar8[uVar14]);
              }
              uVar6 = 1;
              bVar18 = !bVar5;
              bVar5 = false;
              if (bVar18) {
                return;
              }
            } while( true );
          }
          goto LAB_00600514;
        }
      }
      pGVar2 = pGVar12->pObjs;
      if ((pGVar2 <= pGVar16) && (pGVar16 < pGVar2 + pGVar12->nObjs)) {
        uVar14 = (int)((long)pGVar16 - (long)pGVar2 >> 2) * -0x55555555;
        if (((int)uVar14 < 0) || (p->vIds->nSize <= (int)uVar14)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar11 = p->vIds->pArray[uVar14 & 0x7fffffff];
        if ((int)uVar11 < 0) {
          __assert_fail("Ga2_ObjId(p,pObj) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x57,"Vec_Int_t *Ga2_ObjCnf0(Ga2_Man_t *, Gia_Obj_t *)");
        }
        iVar7 = p->vCnfs->nSize;
        if (((int)(uVar11 * 2) < iVar7) && (uVar9 = uVar11 * 2 | 1, (int)uVar9 < iVar7)) {
          ppvVar3 = p->vCnfs->pArray;
          Ga2_ManCnfAddStatic(p->pSat,(Vec_Int_t *)ppvVar3[(ulong)uVar11 * 2],
                              (Vec_Int_t *)ppvVar3[uVar9],p->vLits->pArray,uVar6,uVar14);
          return;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      goto LAB_00600514;
    }
  }
  local_64 = uVar6 ^ 1;
  pGVar16 = pGVar12->pObjs;
  if ((pGVar16 <= pObj) && (pObj < pGVar16 + pGVar12->nObjs)) {
    sat_solver2_addclause
              (p->pSat,(lit *)&local_64,(lit *)&local_60,
               (int)((ulong)((long)pObj - (long)pGVar16) >> 2) * -0x55555555);
    return;
  }
LAB_00600514:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void Ga2_ManAddToAbsOneStatic( Ga2_Man_t * p, Gia_Obj_t * pObj, int f, int fUseId )
{
    Vec_Int_t * vLeaves;
    Gia_Obj_t * pLeaf;
    int k, Lit, iLitOut = Ga2_ObjFindOrAddLit( p, pObj, f );
    assert( iLitOut > 1 );
    assert( Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsConst0(pObj) || (f == 0 && Gia_ObjIsRo(p->pGia, pObj)) )
    {
        iLitOut = Abc_LitNot( iLitOut );
        sat_solver2_addclause( p->pSat, &iLitOut, &iLitOut + 1, fUseId ? Gia_ObjId(p->pGia, pObj) : -1 );
    }
    else
    {
        int fUseStatic = 1;
        Vec_IntClear( p->vLits );
        vLeaves = Ga2_ObjLeaves( p->pGia, pObj );
        Gia_ManForEachObjVec( vLeaves, p->pGia, pLeaf, k )
        {
            Lit = Ga2_ObjFindOrAddLit( p, pLeaf, f - Gia_ObjIsRo(p->pGia, pObj) );
            Vec_IntPush( p->vLits, Lit );
            if ( Lit < 2 )
                fUseStatic = 0;
        }
        if ( fUseStatic || Gia_ObjIsRo(p->pGia, pObj) )
            Ga2_ManCnfAddStatic( p->pSat, Ga2_ObjCnf0(p, pObj), Ga2_ObjCnf1(p, pObj), Vec_IntArray(p->vLits), iLitOut, fUseId ? Gia_ObjId(p->pGia, pObj) : -1 );
        else
        {
            unsigned uTruth = Ga2_ObjComputeTruthSpecial( p->pGia, pObj, vLeaves, p->vLits );
            Ga2_ManCnfAddDynamic( p, uTruth & 0xFFFF, Vec_IntArray(p->vLits), iLitOut, Gia_ObjId(p->pGia, pObj) );
        }
    }
}